

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DashTests.cpp
# Opt level: O3

void __thiscall agge::tests::DashTests::DashTests(DashTests *this)

{
  registry *prVar1;
  
  prVar1 = ut::registry_instance();
  ut::registry::add_test<agge::tests::DashTests>
            (prVar1,(offset_in_DashTests_to_subr)SegmentAreOutputtedAsIsIfDashIsLong,(char *)0x0);
  prVar1 = ut::registry_instance();
  ut::registry::add_test<agge::tests::DashTests>
            (prVar1,(offset_in_DashTests_to_subr)SegmentIsLimitedToADash,(char *)0x0);
  prVar1 = ut::registry_instance();
  ut::registry::add_test<agge::tests::DashTests>
            (prVar1,(offset_in_DashTests_to_subr)ThePatternIsAppliedPeriodically,(char *)0x0);
  prVar1 = ut::registry_instance();
  ut::registry::add_test<agge::tests::DashTests>
            (prVar1,(offset_in_DashTests_to_subr)PointsWithinGapsAreNotEmitted,(char *)0x0);
  prVar1 = ut::registry_instance();
  ut::registry::add_test<agge::tests::DashTests>
            (prVar1,(offset_in_DashTests_to_subr)EmittedSourcePointsCanBeFollowedWithGap,(char *)0x0
            );
  prVar1 = ut::registry_instance();
  ut::registry::add_test<agge::tests::DashTests>
            (prVar1,(offset_in_DashTests_to_subr)MultipleDashPatternIsSupported,(char *)0x0);
  prVar1 = ut::registry_instance();
  ut::registry::add_test<agge::tests::DashTests>
            (prVar1,(offset_in_DashTests_to_subr)ClosedPolygonProducesDashesForTheClosingSegment,
             (char *)0x0);
  prVar1 = ut::registry_instance();
  ut::registry::add_test<agge::tests::DashTests>
            (prVar1,(offset_in_DashTests_to_subr)DashStartIsRespectedForASingleDashWhenGapIsHit,
             (char *)0x0);
  prVar1 = ut::registry_instance();
  ut::registry::add_test<agge::tests::DashTests>
            (prVar1,(offset_in_DashTests_to_subr)DashStartIsRespectedForASingleDashWhenDashIsHit,
             (char *)0x0);
  prVar1 = ut::registry_instance();
  ut::registry::add_test<agge::tests::DashTests>
            (prVar1,(offset_in_DashTests_to_subr)DashStartIsRespectedForAWholePeriod,(char *)0x0);
  prVar1 = ut::registry_instance();
  ut::registry::add_test<agge::tests::DashTests>
            (prVar1,(offset_in_DashTests_to_subr)DashStartIsRespectedForAMultiDashWhenDashIsHit,
             (char *)0x0);
  prVar1 = ut::registry_instance();
  ut::registry::add_test<agge::tests::DashTests>
            (prVar1,(offset_in_DashTests_to_subr)NoEmptySegmentsAreAddedIfDashStartEqualsDashLength,
             (char *)0x0);
  return;
}

Assistant:

test( SegmentAreOutputtedAsIsIfDashIsLong )
			{
				// INIT
				dash d;

				// INIT / ACT
				d.add_dash(6.0f, 1.0f);

				// ACT
				move_to(d, 1.1f, 17.0f);
				line_to(d, 4.1f, 13.0f);
				mocks::path::point result1[] = { vertex(d), vertex(d), vertex(d), };

				// ASSERT
				mocks::path::point reference1[] = {
					{ 1.1f, 17.0f, path_command_move_to },
					{ 4.1f, 13.0f, path_command_line_to },
					{ 0.0f, 0.0f, path_command_stop },
				};

				assert_equal(reference1, result1);

				// ACT
				d.remove_all();
				move_to(d, 1.0f, 1.0f);
				line_to(d, 2.5f, 3.0f);
				line_to(d, 2.7f, 3.1f);
				mocks::path::point result2[] = { vertex(d), vertex(d), vertex(d), vertex(d), };

				// ASSERT
				mocks::path::point reference2[] = {
					{ 1.0f, 1.0f, path_command_move_to },
					{ 2.5f, 3.0f, path_command_line_to },
					{ 2.7f, 3.1f, path_command_line_to },
					{ 0.0f, 0.0f, path_command_stop },
				};

				assert_equal(reference2, result2);
			}